

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  CodeHolder *this_00;
  Logger *this_01;
  Section *pSVar1;
  ulong uVar2;
  Error EVar3;
  ulong uVar4;
  Error unaff_EBP;
  uint8_t *__dest;
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
    return EVar3;
  }
  if (dataSize == 0) {
LAB_00111d10:
    EVar3 = 0;
  }
  else {
    __dest = this->_bufferPtr;
    EVar3 = 0;
    if ((ulong)((long)this->_bufferEnd - (long)__dest) < dataSize) {
      unaff_EBP = CodeHolder::growBuffer(this_00,&this->_section->_buffer,dataSize);
      if (unaff_EBP != 0) goto LAB_00111d5b;
      __dest = this->_bufferPtr;
      EVar3 = 0;
      goto LAB_00111d4c;
    }
    while (EVar3 == 0) {
      memcpy(__dest,data,dataSize);
      __dest = __dest + dataSize;
      this_01 = (this->super_BaseEmitter)._logger;
      if (this_01 != (Logger *)0x0) {
        Logger::logBinary(this_01,data,dataSize);
      }
      pSVar1 = this->_section;
      uVar4 = (long)__dest - (long)this->_bufferData;
      if (uVar4 <= (pSVar1->_buffer)._capacity) {
        this->_bufferPtr = __dest;
        uVar2 = (pSVar1->_buffer)._size;
        if (uVar4 < uVar2) {
          uVar4 = uVar2;
        }
        (pSVar1->_buffer)._size = uVar4;
        goto LAB_00111d10;
      }
      embed();
LAB_00111d5b:
      EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,unaff_EBP,(char *)0x0);
LAB_00111d4c:
      if (unaff_EBP == 0) {
        EVar3 = 0;
      }
    }
  }
  return EVar3;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    _logger->logBinary(data, dataSize);
#endif

  writer.done(this);
  return kErrorOk;
}